

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int cmsysProcess_SetWorkingDirectory(cmsysProcess *cp,char *dir)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *dir_local;
  cmsysProcess *cp_local;
  
  if (cp == (cmsysProcess *)0x0) {
    cp_local._4_4_ = 0;
  }
  else if (cp->WorkingDirectory == dir) {
    cp_local._4_4_ = 1;
  }
  else {
    if (((cp->WorkingDirectory != (char *)0x0) && (dir != (char *)0x0)) &&
       (iVar1 = strcmp(cp->WorkingDirectory,dir), iVar1 == 0)) {
      return 1;
    }
    if (cp->WorkingDirectory != (char *)0x0) {
      free(cp->WorkingDirectory);
      cp->WorkingDirectory = (char *)0x0;
    }
    if (dir != (char *)0x0) {
      sVar2 = strlen(dir);
      pcVar3 = (char *)malloc(sVar2 + 1);
      cp->WorkingDirectory = pcVar3;
      if (cp->WorkingDirectory == (char *)0x0) {
        return 0;
      }
      strcpy(cp->WorkingDirectory,dir);
    }
    cp_local._4_4_ = 1;
  }
  return cp_local._4_4_;
}

Assistant:

int kwsysProcess_SetWorkingDirectory(kwsysProcess* cp, const char* dir)
{
  if(!cp)
    {
    return 0;
    }
  if(cp->WorkingDirectory == dir)
    {
    return 1;
    }
  if(cp->WorkingDirectory && dir && strcmp(cp->WorkingDirectory, dir) == 0)
    {
    return 1;
    }
  if(cp->WorkingDirectory)
    {
    free(cp->WorkingDirectory);
    cp->WorkingDirectory = 0;
    }
  if(dir)
    {
    cp->WorkingDirectory = (char*)malloc(strlen(dir) + 1);
    if(!cp->WorkingDirectory)
      {
      return 0;
      }
    strcpy(cp->WorkingDirectory, dir);
    }
  return 1;
}